

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O1

void __thiscall tst_qpromise_operators::equalTo_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  bool bVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  bool local_4a;
  bool local_49;
  QPromise<void> p1;
  QPromise<void> p0;
  
  QtPromise::QPromise<void>::resolve();
  QtPromise::QPromise<void>::resolve();
  QVar3 = p1.super_QPromiseBase<void>.m_d;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_49 = p0.super_QPromiseBase<void>.m_d.d == p1.super_QPromiseBase<void>.m_d.d;
  bVar2 = !local_49;
  local_4a = false;
  pcVar6 = QTest::toString<bool>(&local_49);
  pcVar7 = QTest::toString<bool>(&local_4a);
  cVar5 = QTest::compare_helper
                    (bVar2,"Compared values are not the same",pcVar6,pcVar7,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0xa8);
  if (cVar5 != '\0') {
    local_49 = p0.super_QPromiseBase<void>.m_d.d == QVar3.d;
    bVar2 = !local_49;
    local_4a = false;
    pcVar6 = QTest::toString<bool>(&local_49);
    pcVar7 = QTest::toString<bool>(&local_4a);
    cVar5 = QTest::compare_helper
                      (bVar2,"Compared values are not the same",pcVar6,pcVar7,"p0 == p2","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0xa9);
    if (cVar5 != '\0') {
      local_49 = p0.super_QPromiseBase<void>.m_d.d == QVar3.d;
      bVar2 = !local_49;
      local_4a = false;
      pcVar6 = QTest::toString<bool>(&local_49);
      pcVar7 = QTest::toString<bool>(&local_4a);
      cVar5 = QTest::compare_helper
                        (bVar2,"Compared values are not the same",pcVar6,pcVar7,"p0 == p3","false",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0xaa);
      QVar4 = p1.super_QPromiseBase<void>.m_d;
      if (cVar5 != '\0') {
        local_49 = p1.super_QPromiseBase<void>.m_d.d == QVar3.d;
        local_4a = true;
        pcVar6 = QTest::toString<bool>(&local_49);
        pcVar7 = QTest::toString<bool>(&local_4a);
        cVar5 = QTest::compare_helper
                          (QVar4.d == QVar3.d,"Compared values are not the same",pcVar6,pcVar7,
                           "p1 == p2","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0xab);
        QVar4 = p1.super_QPromiseBase<void>.m_d;
        if (cVar5 != '\0') {
          local_49 = p1.super_QPromiseBase<void>.m_d.d == QVar3.d;
          local_4a = true;
          pcVar6 = QTest::toString<bool>(&local_49);
          pcVar7 = QTest::toString<bool>(&local_4a);
          cVar5 = QTest::compare_helper
                            (QVar4.d == QVar3.d,"Compared values are not the same",pcVar6,pcVar7,
                             "p1 == p3","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0xac);
          if (cVar5 != '\0') {
            local_49 = true;
            local_4a = true;
            pcVar6 = QTest::toString<bool>(&local_49);
            pcVar7 = QTest::toString<bool>(&local_4a);
            QTest::compare_helper
                      (true,"Compared values are not the same",pcVar6,pcVar7,"p2 == p3","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0xad);
          }
        }
      }
    }
  }
  if (QVar3.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((QVar3.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*((QVar3.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(QVar3.d);
    }
    if (QVar3.d != (PromiseData<void> *)0x0) {
      LOCK();
      pQVar1 = &((QVar3.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*((QVar3.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(QVar3.d);
      }
    }
  }
  p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011cab0;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_operators::equalTo_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();
    auto p1 = QtPromise::QPromise<void>::resolve();
    auto p2 = p1;
    auto p3(p2);

    QCOMPARE(p0 == p1, false);
    QCOMPARE(p0 == p2, false);
    QCOMPARE(p0 == p3, false);
    QCOMPARE(p1 == p2, true);
    QCOMPARE(p1 == p3, true);
    QCOMPARE(p2 == p3, true);
}